

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::bt_peer_connection::on_reject_request(bt_peer_connection *this,int received)

{
  crypto_receive_buffer *this_00;
  undefined1 auVar1 [12];
  bool bVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  span<const_char> sVar6;
  peer_request r;
  error_code local_20;
  
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  if (((this->super_peer_connection).field_0x889 & 4) != 0) {
    this_00 = &this->m_recv_buffer;
    iVar3 = crypto_receive_buffer::packet_size(this_00);
    if (iVar3 == 0xd) {
      bVar2 = crypto_receive_buffer::packet_finished(this_00);
      if (!bVar2) {
        return;
      }
      sVar6 = crypto_receive_buffer::get(this_00);
      auVar1 = (undefined1  [12])local_20._4_12_;
      pcVar4 = sVar6.m_ptr;
      lVar5 = 0;
      local_20.val_ = 0;
      do {
        local_20.val_ = (uint)(byte)pcVar4[lVar5 + 1] | local_20.val_ << 8;
        lVar5 = lVar5 + 1;
      } while ((int)lVar5 != 4);
      lVar5 = 0;
      local_20._4_4_ = 0;
      do {
        local_20._4_4_ = (uint)(byte)pcVar4[lVar5 + 5] | local_20._4_4_ << 8;
        lVar5 = lVar5 + 1;
      } while ((int)lVar5 != 4);
      lVar5 = 0;
      local_20.cat_._0_4_ = 0;
      do {
        local_20.cat_._0_4_ = (uint)(byte)pcVar4[lVar5 + 9] | (uint)local_20.cat_ << 8;
        lVar5 = lVar5 + 1;
      } while ((int)lVar5 != 4);
      local_20.cat_._4_4_ = auVar1._8_4_;
      peer_connection::incoming_reject_request
                (&this->super_peer_connection,(peer_request *)&local_20);
      return;
    }
  }
  local_20 = errors::make_error_code(invalid_reject);
  (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
            (this,&local_20,1,2);
  return;
}

Assistant:

void bt_peer_connection::on_reject_request(int received)
	{
		INVARIANT_CHECK;

		received_bytes(0, received);
		if (!m_supports_fast || m_recv_buffer.packet_size() != 13)
		{
			disconnect(errors::invalid_reject, operation_t::bittorrent, peer_error);
			return;
		}

		if (!m_recv_buffer.packet_finished()) return;

		span<char const> recv_buffer = m_recv_buffer.get();

		peer_request r;
		const char* ptr = recv_buffer.data() + 1;
		r.piece = piece_index_t(aux::read_int32(ptr));
		r.start = aux::read_int32(ptr);
		r.length = aux::read_int32(ptr);

		incoming_reject_request(r);
	}